

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor.h
# Opt level: O2

void hiberlite::access::destroy<hiberlite::KillChildren,std::__cxx11::string>
               (KillChildren *param_1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *c)

{
  if (c != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::__cxx11::string::~string((string *)c);
  }
  operator_delete(c);
  return;
}

Assistant:

static void destroy(A& /*a*/, C* c)
	{
		delete c;
	}